

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void sortScripts(vector<chatra::Script,_std::allocator<chatra::Script>_> *scripts)

{
  pointer pSVar1;
  pointer pSVar2;
  long lVar3;
  ulong uVar4;
  __normal_iterator<chatra::Script_*,_std::vector<chatra::Script,_std::allocator<chatra::Script>_>_>
  __i;
  pointer pSVar5;
  
  pSVar1 = (scripts->super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (scripts->super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar1 != pSVar2) {
    uVar4 = (long)pSVar2 - (long)pSVar1 >> 6;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<chatra::Script*,std::vector<chatra::Script,std::allocator<chatra::Script>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<sortScripts(std::vector<chatra::Script,std::allocator<chatra::Script>>&)::__0>>
              (pSVar1,pSVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pSVar2 - (long)pSVar1 < 0x401) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<chatra::Script*,std::vector<chatra::Script,std::allocator<chatra::Script>>>,__gnu_cxx::__ops::_Iter_comp_iter<sortScripts(std::vector<chatra::Script,std::allocator<chatra::Script>>&)::__0>>
                (pSVar1,pSVar2);
      return;
    }
    pSVar5 = pSVar1 + 0x10;
    std::
    __insertion_sort<__gnu_cxx::__normal_iterator<chatra::Script*,std::vector<chatra::Script,std::allocator<chatra::Script>>>,__gnu_cxx::__ops::_Iter_comp_iter<sortScripts(std::vector<chatra::Script,std::allocator<chatra::Script>>&)::__0>>
              (pSVar1,pSVar5);
    for (; pSVar5 != pSVar2; pSVar5 = pSVar5 + 1) {
      std::
      __unguarded_linear_insert<__gnu_cxx::__normal_iterator<chatra::Script*,std::vector<chatra::Script,std::allocator<chatra::Script>>>,__gnu_cxx::__ops::_Val_comp_iter<sortScripts(std::vector<chatra::Script,std::allocator<chatra::Script>>&)::__0>>
                (pSVar5);
    }
  }
  return;
}

Assistant:

static void sortScripts(std::vector<cha::Script>& scripts) {
	std::sort(scripts.begin(), scripts.end(), [](const cha::Script& a, const cha::Script& b) {
		return a.name < b.name;
	});
}